

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitTry(PrintSExpression *this,Try *curr)

{
  ulong uVar1;
  char *pcVar2;
  Name *pNVar3;
  Expression **ppEVar4;
  ostream *in_RCX;
  ostream *o;
  size_t i;
  ulong index;
  Name name;
  Name name_00;
  
  this->controlFlowDepth = this->controlFlowDepth + 1;
  std::operator<<(this->o,'(');
  printExpressionContents(this,(Expression *)curr);
  incIndent(this);
  doIndent(this->o,this->indent);
  std::operator<<(this->o,'(');
  printMedium(this->o,"do");
  incIndent(this);
  maybePrintImplicitBlock(this,curr->body,true);
  decIndent(this);
  std::operator<<(this->o,"\n");
  for (index = 0;
      uVar1 = (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
              usedElements, index < uVar1; index = index + 1) {
    doIndent(this->o,this->indent);
    printDebugDelimiterLocation(this,(Expression *)curr,(Index)index);
    std::operator<<(this->o,'(');
    printMedium(this->o,"catch ");
    pNVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                       (&(curr->catchTags).
                         super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,index);
    name.super_IString.str._M_str = (char *)this->o;
    name.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    anon_unknown_217::printName((anon_unknown_217 *)(pNVar3->super_IString).str._M_len,name,in_RCX);
    incIndent(this);
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                        (&(curr->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                         ,index);
    maybePrintImplicitBlock(this,*ppEVar4,true);
    decIndent(this);
    std::operator<<(this->o,"\n");
  }
  o = (ostream *)
      ((curr->catchBodies).
       super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements -
      uVar1);
  if (o == (ostream *)0x1) {
    doIndent(this->o,this->indent);
    printDebugDelimiterLocation
              (this,(Expression *)curr,
               (Index)(curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      usedElements);
    std::operator<<(this->o,'(');
    printMedium(this->o,"catch_all");
    incIndent(this);
    ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                        (&(curr->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                        );
    maybePrintImplicitBlock(this,*ppEVar4,true);
    decIndent(this);
    std::operator<<(this->o,"\n");
  }
  this->controlFlowDepth = this->controlFlowDepth + -1;
  if ((curr->delegateTarget).super_IString.str._M_str != (char *)0x0) {
    doIndent(this->o,this->indent);
    std::operator<<(this->o,'(');
    printMedium(this->o,"delegate ");
    pcVar2 = (curr->delegateTarget).super_IString.str._M_str;
    if (pcVar2 == DAT_00e63dc8) {
      std::ostream::operator<<(this->o,this->controlFlowDepth);
    }
    else {
      name_00.super_IString.str._M_str = (char *)this->o;
      name_00.super_IString.str._M_len = (size_t)pcVar2;
      anon_unknown_217::printName
                ((anon_unknown_217 *)(curr->delegateTarget).super_IString.str._M_len,name_00,o);
    }
    std::operator<<(this->o,")\n");
  }
  decIndent(this);
  if (this->full == true) {
    std::operator<<(this->o," ;; end try");
    return;
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    controlFlowDepth++;
    o << '(';
    printExpressionContents(curr);
    incIndent();
    doIndent(o, indent);
    o << '(';
    printMedium(o, "do");
    incIndent();
    maybePrintImplicitBlock(curr->body, true);
    decIndent();
    o << "\n";
    for (size_t i = 0; i < curr->catchTags.size(); i++) {
      doIndent(o, indent);
      printDebugDelimiterLocation(curr, i);
      o << '(';
      printMedium(o, "catch ");
      printName(curr->catchTags[i], o);
      incIndent();
      maybePrintImplicitBlock(curr->catchBodies[i], true);
      decIndent();
      o << "\n";
    }
    if (curr->hasCatchAll()) {
      doIndent(o, indent);
      printDebugDelimiterLocation(curr, curr->catchTags.size());
      o << '(';
      printMedium(o, "catch_all");
      incIndent();
      maybePrintImplicitBlock(curr->catchBodies.back(), true);
      decIndent();
      o << "\n";
    }
    controlFlowDepth--;

    if (curr->isDelegate()) {
      doIndent(o, indent);
      o << '(';
      printMedium(o, "delegate ");
      if (curr->delegateTarget == DELEGATE_CALLER_TARGET) {
        o << controlFlowDepth;
      } else {
        printName(curr->delegateTarget, o);
      }
      o << ")\n";
    }
    decIndent();
    if (full) {
      o << " ;; end try";
    }
  }